

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O1

void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  Ivy_Obj_t *pObj_00;
  Vec_Ptr_t *vArray;
  void **ppvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x183,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x184,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 10;
  vArray->nSize = 0;
  ppvVar2 = (void **)malloc(0x50);
  vArray->pArray = ppvVar2;
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  if (0 < vArray->nSize) {
    lVar6 = 0;
    do {
      pObj_00 = (Ivy_Obj_t *)vArray->pArray[lVar6];
      if (pObj_00 == (Ivy_Obj_t *)0x0) break;
      uVar1 = *(uint *)&pObj_00->field_0x8;
      uVar3 = uVar1 & 0xf;
      if ((uVar3 != 2) && (uVar3 != 4)) {
        uVar4 = (ulong)pObj_00->pFanin0 & 0xfffffffffffffffe;
        uVar5 = (ulong)pObj_00->pFanin1 & 0xfffffffffffffffe;
        if (*(uint *)(uVar5 + 8) >> 0xb < *(uint *)(uVar4 + 8) >> 0xb) {
          uVar5 = uVar4;
        }
        uVar3 = (*(uint *)(uVar5 + 8) >> 0xb) + (uint)(uVar3 == 6) + 1;
        if (uVar1 >> 0xb != uVar3) {
          *(uint *)&pObj_00->field_0x8 = uVar1 & 0x7ff | uVar3 * 0x800;
          Ivy_ObjUpdateLevel_rec(p,pObj_00);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vArray->nSize);
  }
  if (vArray->pArray != (void **)0x0) {
    free(vArray->pArray);
    vArray->pArray = (void **)0x0;
  }
  free(vArray);
  return;
}

Assistant:

void Ivy_ObjUpdateLevel_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, LevelNew;
    assert( p->fFanout );
    assert( Ivy_ObjIsNode(pObj) );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        if ( Ivy_ObjIsCo(pFanout) )
        {
//            assert( (int)Ivy_ObjFanin0(pFanout)->Level <= p->nLevelMax );
            continue;
        }
        LevelNew = Ivy_ObjLevelNew( pFanout );
        if ( (int)pFanout->Level == LevelNew )
            continue;
        pFanout->Level = LevelNew;
        Ivy_ObjUpdateLevel_rec( p, pFanout );
    }
    Vec_PtrFree( vFanouts );
}